

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http-test.c++
# Opt level: O1

void kj::anon_unknown_0::testHttpClient
               (WaitScope *waitScope,HttpHeaderTable *table,HttpClient *client,
               HttpTestCase *testCase)

{
  anon_union_344_1_a8c68091_for_NullableValue<kj::Exception>_2 *exception_00;
  size_t sVar1;
  undefined8 uVar2;
  undefined4 uVar3;
  long *plVar4;
  HttpTestCase *pHVar5;
  undefined8 uVar6;
  int iVar7;
  char *pcVar8;
  InitializeableArray<kj::StringPtr> *extraout_RDX;
  InitializeableArray<kj::StringPtr> *extraout_RDX_00;
  InitializeableArray<kj::StringPtr> *arr;
  long lVar9;
  HeaderTestCase *pHVar10;
  StringPtr *pSVar11;
  StringPtr *pSVar12;
  char *__s2;
  Disposer *__s1;
  HeaderTestCase *header;
  HeaderTestCase *pHVar13;
  Exception *exception;
  bool bVar14;
  HttpHeaderId id;
  String body;
  Request request;
  anon_class_8_1_a389c060 _kjContextFunc536;
  HttpHeaders headers;
  Response response;
  ContextImpl<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_compat_http_test_c__:536:3)>
  _kjContext536;
  String local_2c8;
  String local_2a8;
  WaitScope *local_290;
  undefined8 *local_288;
  long *local_280;
  undefined8 *local_278;
  long *local_270;
  HttpTestCase *local_268;
  char local_260 [8];
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 local_258;
  HttpTestCase *local_250;
  HttpHeaders local_248;
  ExceptionOrValue local_1e8;
  char local_88;
  Context local_80;
  HttpTestCase **local_38;
  
  local_290 = waitScope;
  local_250 = testCase;
  _::Debug::Context::Context(&local_80);
  local_80.super_ExceptionCallback._vptr_ExceptionCallback = (_func_int **)&PTR__Context_0045aed0;
  local_38 = &local_250;
  HttpHeaders::HttpHeaders(&local_248,table);
  sVar1 = (testCase->request).requestHeaders.super_Array<kj::(anonymous_namespace)::HeaderTestCase>.
          size_;
  if (sVar1 != 0) {
    pHVar13 = (testCase->request).requestHeaders.
              super_Array<kj::(anonymous_namespace)::HeaderTestCase>.ptr;
    pHVar10 = pHVar13 + sVar1;
    do {
      uVar2 = (pHVar13->id).table;
      uVar3 = (pHVar13->id).id;
      id.id = uVar3;
      id.table = (HttpHeaderTable *)uVar2;
      id._12_4_ = 0;
      HttpHeaders::set(&local_248,id,(StringPtr)(pHVar13->value).content);
      pHVar13 = pHVar13 + 1;
    } while (pHVar13 != pHVar10);
  }
  pcVar8 = (testCase->request).path.content.ptr;
  local_260[0] = (testCase->request).requestBodySize.ptr.isSet;
  if ((bool)local_260[0] == true) {
    local_258 = (testCase->request).requestBodySize.ptr.field_1;
  }
  (**client->_vptr_HttpClient)
            (&local_288,client,(ulong)(testCase->request).method,pcVar8,
             (testCase->request).path.content.size_,&local_248,local_260);
  sVar1 = (testCase->request).requestBodyParts.super_Array<kj::StringPtr>.size_;
  local_268 = testCase;
  if (sVar1 != 0) {
    pSVar11 = (testCase->request).requestBodyParts.super_Array<kj::StringPtr>.ptr;
    pSVar12 = pSVar11 + sVar1;
    exception_00 = &local_1e8.exception.ptr.field_1;
    do {
      pcVar8 = (char *)((pSVar11->content).size_ - 1);
      (**(code **)*local_280)
                ((Own<kj::_::PromiseNode> *)&local_2c8,local_280,(pSVar11->content).ptr);
      local_1e8.exception.ptr._0_4_ = local_1e8.exception.ptr._0_4_ & 0xffffff00;
      local_88 = '\0';
      _::waitImpl((Own<kj::_::PromiseNode> *)&local_2c8,&local_1e8,local_290);
      if (local_88 == '\x01') {
        if (local_1e8.exception.ptr.isSet != false) {
          throwRecoverableException(&exception_00->value,0);
        }
      }
      else {
        if (local_1e8.exception.ptr.isSet == false) {
          _::unreachable();
        }
        throwRecoverableException(&exception_00->value,0);
      }
      if (local_1e8.exception.ptr.isSet == true) {
        Exception::~Exception(&exception_00->value);
      }
      sVar1 = local_2c8.content.size_;
      if ((PromiseNode *)local_2c8.content.size_ != (PromiseNode *)0x0) {
        local_2c8.content.size_ = 0;
        (***(_func_int ***)local_2c8.content.ptr)
                  (local_2c8.content.ptr,(*(_func_int ***)sVar1)[-2] + (long)(_func_int ***)sVar1);
      }
      pSVar11 = pSVar11 + 1;
    } while (pSVar11 != pSVar12);
  }
  plVar4 = local_280;
  if (local_280 != (long *)0x0) {
    local_280 = (long *)0x0;
    (**(code **)*local_288)(local_288,(long)plVar4 + *(long *)(*plVar4 + -0x10));
  }
  Promise<kj::HttpClient::Response>::wait
            ((Promise<kj::HttpClient::Response> *)&local_1e8,&local_278);
  pHVar5 = local_268;
  if (((local_268->response).statusCode != (ulong)(uint)local_1e8.exception.ptr._0_4_) &&
     (_::Debug::minSeverity < 3)) {
    pcVar8 = "\"failed: expected \" \"response.statusCode == testCase.response.statusCode\"";
    _::Debug::log<char_const(&)[69]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
               ,0x228,ERROR,
               "\"failed: expected \" \"response.statusCode == testCase.response.statusCode\"",
               (char (*) [69])"failed: expected response.statusCode == testCase.response.statusCode"
              );
  }
  AsyncInputStream::readAllText
            ((AsyncInputStream *)&local_2a8,local_1e8.exception.ptr.field_1._32_8_);
  Promise<kj::String>::wait((Promise<kj::String> *)&local_2c8,&local_2a8);
  sVar1 = local_2a8.content.size_;
  arr = extraout_RDX;
  if ((long *)local_2a8.content.size_ != (long *)0x0) {
    local_2a8.content.size_ = 0;
    (*(code *)**(undefined8 **)local_2a8.content.ptr)
              (local_2a8.content.ptr,sVar1 + *(long *)(*(long *)sVar1 + -0x10));
    arr = extraout_RDX_00;
  }
  if ((pHVar5->request).method == HEAD) {
    if (((PromiseNode *)0x1 < local_2c8.content.size_) && (_::Debug::minSeverity < 3)) {
      _::Debug::log<char_const(&)[28]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
                 ,0x22b,ERROR,"\"failed: expected \" \"body == \\\"\\\"\"",
                 (char (*) [28])"failed: expected body == \"\"");
    }
  }
  else {
    strArray<kj::(anonymous_namespace)::InitializeableArray<kj::StringPtr>const&>
              (&local_2a8,(kj *)&(pHVar5->response).responseBodyParts,arr,pcVar8);
    sVar1 = local_2a8.content.size_;
    pcVar8 = local_2a8.content.ptr;
    lVar9 = (long)(_func_int ***)local_2c8.content.size_ +
            (ulong)((PromiseNode *)local_2c8.content.size_ == (PromiseNode *)0x0);
    bVar14 = true;
    if (lVar9 == local_2a8.content.size_ + ((long *)local_2a8.content.size_ == (long *)0x0)) {
      __s2 = local_2a8.content.ptr;
      if ((long *)local_2a8.content.size_ == (long *)0x0) {
        __s2 = "";
      }
      __s1 = (Disposer *)0x385fb3;
      if ((PromiseNode *)local_2c8.content.size_ != (PromiseNode *)0x0) {
        __s1 = (Disposer *)local_2c8.content.ptr;
      }
      iVar7 = bcmp(__s1,__s2,lVar9 - 1);
      bVar14 = iVar7 != 0;
    }
    if (pcVar8 != (char *)0x0) {
      local_2a8.content.ptr = (char *)0x0;
      local_2a8.content.size_ = 0;
      (**(local_2a8.content.disposer)->_vptr_ArrayDisposer)
                (local_2a8.content.disposer,pcVar8,1,sVar1,sVar1,0);
    }
    if ((bool)(bVar14 & _::Debug::minSeverity < 3)) {
      _::Debug::log<char_const(&)[79],kj::String&>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
                 ,0x22d,ERROR,
                 "\"failed: expected \" \"body == kj::strArray(testCase.response.responseBodyParts, \\\"\\\")\", body"
                 ,(char (*) [79])
                  "failed: expected body == kj::strArray(testCase.response.responseBodyParts, \"\")"
                 ,&local_2c8);
    }
  }
  sVar1 = local_2c8.content.size_;
  pcVar8 = local_2c8.content.ptr;
  if ((Disposer *)local_2c8.content.ptr != (Disposer *)0x0) {
    local_2c8.content.ptr = (char *)0x0;
    local_2c8.content.size_ = 0;
    (**(local_2c8.content.disposer)->_vptr_ArrayDisposer)
              (local_2c8.content.disposer,pcVar8,1,sVar1,sVar1,0);
  }
  uVar6 = local_1e8.exception.ptr.field_1._32_8_;
  if ((long *)local_1e8.exception.ptr.field_1._32_8_ != (long *)0x0) {
    local_1e8.exception.ptr.field_1._32_8_ = (long *)0x0;
    (*(code *)**(undefined8 **)local_1e8.exception.ptr.field_1.value.file)
              (local_1e8.exception.ptr.field_1.value.file,uVar6 + *(long *)(*(long *)uVar6 + -0x10))
    ;
  }
  plVar4 = local_270;
  if (local_270 != (long *)0x0) {
    local_270 = (long *)0x0;
    (**(code **)*local_278)(local_278,(long)plVar4 + *(long *)(*plVar4 + -0x10));
  }
  plVar4 = local_280;
  if (local_280 != (long *)0x0) {
    local_280 = (long *)0x0;
    (**(code **)*local_288)(local_288,(long)plVar4 + *(long *)(*plVar4 + -0x10));
  }
  HttpHeaders::~HttpHeaders(&local_248);
  _::Debug::Context::~Context(&local_80);
  return;
}

Assistant:

void testHttpClient(kj::WaitScope& waitScope, HttpHeaderTable& table,
                    HttpClient& client, const HttpTestCase& testCase) {
  KJ_CONTEXT(testCase.request.raw, testCase.response.raw);

  HttpHeaders headers(table);
  for (auto& header: testCase.request.requestHeaders) {
    headers.set(header.id, header.value);
  }

  auto request = client.request(
      testCase.request.method, testCase.request.path, headers, testCase.request.requestBodySize);
  for (auto& part: testCase.request.requestBodyParts) {
    request.body->write(part.begin(), part.size()).wait(waitScope);
  }
  request.body = nullptr;

  auto response = request.response.wait(waitScope);

  KJ_EXPECT(response.statusCode == testCase.response.statusCode);
  auto body = response.body->readAllText().wait(waitScope);
  if (testCase.request.method == HttpMethod::HEAD) {
    KJ_EXPECT(body == "");
  } else {
    KJ_EXPECT(body == kj::strArray(testCase.response.responseBodyParts, ""), body);
  }
}